

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_build_rwkv7_base::build_rwkv7_time_mix
          (llm_build_rwkv7_base *this,ggml_cgraph *gf,ggml_tensor *cur,ggml_tensor *x_prev,
          ggml_tensor *state_copy,ggml_tensor *state_mask,ggml_tensor **first_layer_value,
          llama_ubatch *ubatch,int il)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  int iVar6;
  undefined4 uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  const_reference pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  undefined8 uVar14;
  ggml_tensor *pgVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  ggml_tensor *pgVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  const_reference ppgVar22;
  undefined8 uVar23;
  long lVar24;
  uint uVar25;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ggml_cgraph *in_RSI;
  long in_RDI;
  int32_t in_R9D;
  bool bVar26;
  long *in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  ggml_tensor *rk;
  ggml_tensor *wkv_output;
  ggml_tensor *wkv_state;
  ggml_tensor *ka;
  ggml_tensor *kk;
  ggml_tensor *a;
  ggml_tensor *g;
  ggml_tensor *v;
  ggml_tensor *k;
  ggml_tensor *w;
  ggml_tensor *r;
  ggml_tensor *xg;
  ggml_tensor *xa;
  ggml_tensor *xv;
  ggml_tensor *xk;
  ggml_tensor *xw;
  ggml_tensor *xr;
  ggml_tensor *xxx;
  ggml_tensor *dummy;
  ggml_tensor *sx;
  bool has_gating;
  value_type *layer;
  uint32_t kv_head;
  uint32_t n_seq_tokens;
  uint32_t head_count;
  uint32_t head_size;
  uint32_t n_embd;
  uint32_t n_seqs;
  uint32_t n_tokens;
  llama_kv_cache_unified *kv_self;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffd98;
  ggml_tensor *pgVar27;
  llm_graph_context *in_stack_fffffffffffffda0;
  llm_graph_context *this_00;
  int32_t n_state;
  ggml_tensor *state_mask_00;
  ggml_tensor *state_copy_00;
  ggml_cgraph *gf_00;
  value_type pgVar28;
  undefined8 local_128;
  undefined8 local_d8;
  ggml_tensor *local_d0;
  undefined8 local_18;
  
  lVar24 = *(long *)(in_RDI + 0xe8);
  iVar1 = *(int *)(in_stack_00000010 + 4);
  iVar2 = *(int *)(in_stack_00000010 + 0xc);
  uVar3 = *(uint *)(*(long *)(in_RDI + 8) + 8);
  uVar4 = *(uint *)(*(long *)(in_RDI + 8) + 0x1894);
  uVar25 = uVar3 / uVar4;
  uVar5 = *(undefined4 *)(in_stack_00000010 + 8);
  iVar6 = *(int *)(lVar24 + 0x68);
  pvVar10 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                      ((vector<llama_layer,_std::allocator<llama_layer>_> *)
                       (*(long *)(in_RDI + 0x108) + 0x19e0),(long)in_stack_00000018);
  bVar26 = false;
  if (pvVar10->time_mix_g1 != (ggml_tensor *)0x0) {
    bVar26 = pvVar10->time_mix_g2 != (ggml_tensor *)0x0;
  }
  uVar11 = ggml_sub(*(undefined8 *)(in_RDI + 0xc0),in_RCX,in_RDX);
  uVar7 = 5;
  if (bVar26) {
    uVar7 = 6;
  }
  uVar12 = ggml_new_tensor_4d(*(undefined8 *)(in_RDI + 0xc0),0,uVar3,uVar5,iVar2,uVar7);
  uVar12 = ggml_repeat(*(undefined8 *)(in_RDI + 0xc0),uVar11,uVar12);
  uVar11 = *(undefined8 *)(in_RDI + 0xc0);
  uVar12 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar12,pvVar10->time_mix_lerp_fused);
  lVar13 = ggml_add(uVar11,uVar12,in_RDX);
  ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar13,uVar3,iVar1,*(undefined8 *)(lVar13 + 0x38),0);
  uVar11 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar13,uVar3,iVar1,
                        *(undefined8 *)(lVar13 + 0x38),(ulong)(uVar3 * iVar1) << 2);
  ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar13,uVar3,iVar1,*(undefined8 *)(lVar13 + 0x38),
               (ulong)(uVar3 * iVar1 * 2) << 2);
  uVar12 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar13,uVar3,iVar1,
                        *(undefined8 *)(lVar13 + 0x38),(ulong)(uVar3 * iVar1 * 3) << 2);
  uVar14 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar13,uVar3,iVar1,
                        *(undefined8 *)(lVar13 + 0x38),(ulong)(uVar3 * iVar1 * 4) << 2);
  if (bVar26) {
    local_128 = ggml_view_2d(*(undefined8 *)(in_RDI + 0xc0),lVar13,uVar3,iVar1,
                             *(undefined8 *)(lVar13 + 0x38),(ulong)(uVar3 * iVar1 * 5) << 2);
  }
  else {
    local_128 = 0;
  }
  pgVar15 = llm_graph_context::build_lora_mm
                      (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
                      );
  uVar17 = *(undefined8 *)(in_RDI + 0xc0);
  uVar16 = *(undefined8 *)(in_RDI + 0xc0);
  pgVar18 = pvVar10->time_mix_w2;
  uVar20 = *(undefined8 *)(in_RDI + 0xc0);
  uVar11 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),pvVar10->time_mix_w1,uVar11);
  uVar11 = ggml_tanh(uVar20,uVar11);
  uVar11 = ggml_mul_mat(uVar16,pgVar18,uVar11);
  uVar16 = ggml_add(uVar17,uVar11,pvVar10->time_mix_w0);
  uVar11 = *(undefined8 *)(in_RDI + 0xc0);
  uVar17 = *(undefined8 *)(in_RDI + 0xc0);
  uVar16 = ggml_sigmoid(*(undefined8 *)(in_RDI + 0xc0),uVar16);
  uVar17 = ggml_scale(0xbf1b459e,uVar17,uVar16);
  uVar11 = ggml_exp(uVar11,uVar17);
  pgVar18 = llm_graph_context::build_lora_mm
                      (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90
                      );
  local_d0 = llm_graph_context::build_lora_mm
                       (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                        in_stack_fffffffffffffd90);
  if (*in_stack_00000008 == 0) {
    *in_stack_00000008 = (long)local_d0;
  }
  else {
    uVar17 = *(undefined8 *)(in_RDI + 0xc0);
    uVar16 = *(undefined8 *)(in_RDI + 0xc0);
    uVar19 = ggml_sub(*(undefined8 *)(in_RDI + 0xc0),*in_stack_00000008,local_d0);
    uVar20 = *(undefined8 *)(in_RDI + 0xc0);
    uVar21 = *(undefined8 *)(in_RDI + 0xc0);
    uVar23 = *(undefined8 *)(in_RDI + 0xc0);
    pgVar27 = pvVar10->time_mix_v2;
    uVar12 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),pvVar10->time_mix_v1,uVar12);
    uVar12 = ggml_mul_mat(uVar23,pgVar27,uVar12);
    uVar12 = ggml_add(uVar21,uVar12,pvVar10->time_mix_v0);
    uVar12 = ggml_sigmoid(uVar20,uVar12);
    uVar12 = ggml_mul(uVar16,uVar19,uVar12);
    local_d0 = (ggml_tensor *)ggml_add(uVar17,local_d0,uVar12);
  }
  local_d8 = 0;
  if ((pvVar10->time_mix_g1 != (ggml_tensor *)0x0) && (pvVar10->time_mix_g2 != (ggml_tensor *)0x0))
  {
    uVar12 = *(undefined8 *)(in_RDI + 0xc0);
    pgVar27 = pvVar10->time_mix_g2;
    uVar17 = *(undefined8 *)(in_RDI + 0xc0);
    uVar16 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),pvVar10->time_mix_g1,local_128);
    uVar17 = ggml_sigmoid(uVar17,uVar16);
    local_d8 = ggml_mul_mat(uVar12,pgVar27,uVar17);
  }
  this_00 = *(llm_graph_context **)(in_RDI + 0xc0);
  pgVar27 = *(ggml_tensor **)(in_RDI + 0xc0);
  uVar12 = *(undefined8 *)(in_RDI + 0xc0);
  cur_00 = pvVar10->time_mix_a2;
  uVar14 = ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),pvVar10->time_mix_a1,uVar14);
  uVar12 = ggml_mul_mat(uVar12,cur_00,uVar14);
  uVar12 = ggml_add(pgVar27,uVar12,pvVar10->time_mix_a0);
  uVar14 = ggml_sigmoid(this_00,uVar12);
  uVar12 = *(undefined8 *)(in_RDI + 0xc0);
  uVar17 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),pgVar18,pvVar10->time_mix_k_k);
  uVar17 = ggml_reshape_3d(uVar12,uVar17,uVar4,uVar25,iVar1);
  n_state = (int32_t)((ulong)uVar12 >> 0x20);
  uVar12 = ggml_l2_norm(0x2b8cbccc,*(undefined8 *)(in_RDI + 0xc0),uVar17);
  uVar17 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),pgVar18,pvVar10->time_mix_k_a);
  state_copy_00 = *(ggml_tensor **)(in_RDI + 0xc0);
  state_mask_00 = *(ggml_tensor **)(in_RDI + 0xc0);
  uVar16 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar14,uVar17);
  uVar17 = ggml_sub(state_mask_00,uVar16,uVar17);
  uVar17 = ggml_add(state_copy_00,pgVar18,uVar17);
  uVar16 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar15,uVar4,uVar25,iVar1);
  uVar20 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar11,uVar4,uVar25,iVar1);
  uVar17 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar17,uVar4,uVar25,iVar1);
  uVar21 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_d0,uVar4,uVar25,iVar1);
  uVar14 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar14,uVar4,uVar25,iVar1);
  gf_00 = in_RSI;
  ppgVar22 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                       ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar24 + 0xa8),
                        (long)in_stack_00000018);
  pgVar28 = *ppgVar22;
  llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 8));
  pgVar18 = llm_graph_context::build_copy_mask_state
                      ((llm_graph_context *)pgVar28,gf_00,pgVar18,state_copy_00,state_mask_00,
                       n_state,in_R9D);
  uVar11 = *(undefined8 *)(in_RDI + 0xc0);
  uVar23 = ggml_neg(*(undefined8 *)(in_RDI + 0xc0),uVar12);
  uVar12 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar12,uVar14);
  uVar11 = ggml_rwkv_wkv7(uVar11,uVar16,uVar20,uVar17,uVar21,uVar23,uVar12,pgVar18);
  uVar14 = ggml_view_1d(*(undefined8 *)(in_RDI + 0xc0),uVar11,uVar3 * iVar1,0);
  uVar20 = ggml_view_1d(*(undefined8 *)(in_RDI + 0xc0),uVar11,uVar3 * uVar4 * iVar2,
                        (ulong)(uVar3 * iVar1) << 2);
  uVar11 = *(undefined8 *)(in_RDI + 0xc0);
  uVar12 = *(undefined8 *)(in_RDI + 0xc0);
  ppgVar22 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                       ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar24 + 0xa8),
                        (long)in_stack_00000018);
  pgVar28 = *ppgVar22;
  uVar8 = llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 8));
  uVar9 = llama_hparams::n_embd_v_s(*(llama_hparams **)(in_RDI + 8));
  ppgVar22 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                       ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(lVar24 + 0xa8),
                        (long)in_stack_00000018);
  lVar24 = ggml_element_size(*ppgVar22);
  uVar12 = ggml_view_1d(uVar12,pgVar28,uVar8 * iVar2,(ulong)(uVar9 * iVar6) * lVar24);
  uVar11 = ggml_cpy(uVar11,uVar20,uVar12);
  ggml_build_forward_expand(in_RSI,uVar11);
  if ((pvVar10->time_mix_ln == (ggml_tensor *)0x0) || (pvVar10->time_mix_ln_b == (ggml_tensor *)0x0)
     ) {
    local_18 = ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),uVar14,uVar3,iVar1);
  }
  else {
    uVar11 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),uVar14,(ulong)uVar3 / (ulong)uVar25,
                             uVar25,iVar1);
    uVar11 = ggml_norm(0x3a27c5ac,*(undefined8 *)(in_RDI + 0xc0),uVar11);
    uVar12 = ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),uVar11,uVar3,iVar1);
    uVar11 = *(undefined8 *)(in_RDI + 0xc0);
    uVar12 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar12,pvVar10->time_mix_ln);
    local_18 = ggml_add(uVar11,uVar12,pvVar10->time_mix_ln_b);
  }
  uVar11 = *(undefined8 *)(in_RDI + 0xc0);
  uVar12 = *(undefined8 *)(in_RDI + 0xc0);
  uVar14 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar17,uVar16);
  uVar17 = ggml_reshape_2d(*(undefined8 *)(in_RDI + 0xc0),pvVar10->time_mix_r_k,uVar4,uVar25);
  uVar12 = ggml_mul(uVar12,uVar14,uVar17);
  uVar14 = ggml_sum_rows(uVar11,uVar12);
  uVar11 = *(undefined8 *)(in_RDI + 0xc0);
  uVar12 = *(undefined8 *)(in_RDI + 0xc0);
  uVar14 = ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar21,uVar14);
  uVar12 = ggml_reshape_2d(uVar12,uVar14,uVar3,iVar1);
  uVar11 = ggml_add(uVar11,local_18,uVar12);
  if (bVar26) {
    ggml_mul(*(undefined8 *)(in_RDI + 0xc0),uVar11,local_d8);
  }
  pgVar18 = llm_graph_context::build_lora_mm(this_00,pgVar27,cur_00);
  pgVar18 = (ggml_tensor *)ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar18,uVar3,uVar5,iVar2)
  ;
  return pgVar18;
}

Assistant:

ggml_tensor * build_rwkv7_time_mix(
            ggml_cgraph * gf,
            ggml_tensor * cur,
            ggml_tensor * x_prev,
            ggml_tensor * state_copy,
            ggml_tensor * state_mask,
            ggml_tensor *& first_layer_value,
            const llama_ubatch & ubatch,
            int   il) const {
        const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

        const auto n_tokens = ubatch.n_tokens;
        const auto n_seqs = ubatch.n_seqs;
        const auto n_embd = hparams.n_embd;
        const auto head_size = hparams.wkv_head_size;
        const auto head_count = n_embd / head_size;
        const auto n_seq_tokens = ubatch.n_seq_tokens;

        const auto kv_head = kv_self->head;

        const auto & layer = model.layers[il];

        bool has_gating = layer.time_mix_g1 && layer.time_mix_g2;

        ggml_tensor * sx = ggml_sub(ctx0, x_prev, cur);
        ggml_tensor * dummy = ggml_new_tensor_4d(ctx0, GGML_TYPE_F32, n_embd, n_seq_tokens, n_seqs, has_gating ? 6 : 5);
        sx = ggml_repeat(ctx0, sx, dummy);

        ggml_tensor * xxx = ggml_add(ctx0, ggml_mul(ctx0, sx, layer.time_mix_lerp_fused), cur);

        ggml_tensor * xr = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], 0);
        ggml_tensor * xw = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * sizeof(float));
        ggml_tensor * xk = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 2 * sizeof(float));
        ggml_tensor * xv = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 3 * sizeof(float));
        ggml_tensor * xa = ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 4 * sizeof(float));
        ggml_tensor * xg = has_gating ? ggml_view_2d(ctx0, xxx, n_embd, n_tokens, xxx->nb[1], n_embd * n_tokens * 5 * sizeof(float)) : nullptr;

        ggml_tensor * r = build_lora_mm(layer.time_mix_receptance, xr);
        ggml_tensor * w = ggml_add(
            ctx0,
            ggml_mul_mat(ctx0, layer.time_mix_w2, ggml_tanh(ctx0, ggml_mul_mat(ctx0, layer.time_mix_w1, xw))),
            layer.time_mix_w0
        );
        w = ggml_exp(ctx0, ggml_scale(ctx0, ggml_sigmoid(ctx0, w), -0.606531));

        ggml_tensor * k = build_lora_mm(layer.time_mix_key, xk);
        ggml_tensor * v = build_lora_mm(layer.time_mix_value, xv);
        if (first_layer_value == nullptr) {
            first_layer_value = v;
        } else {
            // Add the first layer value as a residual connection.
            v = ggml_add(ctx0, v,
                ggml_mul(ctx0,
                    ggml_sub(ctx0, first_layer_value, v),
                    ggml_sigmoid(ctx0, ggml_add(ctx0,
                            ggml_mul_mat(ctx0, layer.time_mix_v2, ggml_mul_mat(ctx0, layer.time_mix_v1, xv)),
                            layer.time_mix_v0
                        )
                    )
                )
            );
        }

        ggml_tensor * g = nullptr;
        if (layer.time_mix_g1 && layer.time_mix_g2) {
            g = ggml_mul_mat(ctx0, layer.time_mix_g2, ggml_sigmoid(ctx0, ggml_mul_mat(ctx0, layer.time_mix_g1, xg)));
        }

        ggml_tensor * a = ggml_sigmoid(ctx0,
            ggml_add(
                ctx0,
                ggml_mul_mat(ctx0, layer.time_mix_a2, ggml_mul_mat(ctx0, layer.time_mix_a1, xa)),
                layer.time_mix_a0
            )
        );

        ggml_tensor * kk = ggml_reshape_3d(ctx0, ggml_mul(ctx0, k, layer.time_mix_k_k), head_size, head_count, n_tokens);
        kk = ggml_l2_norm(ctx0, kk, 1e-12);

        ggml_tensor * ka = ggml_mul(ctx0, k, layer.time_mix_k_a);
        k = ggml_add(ctx0, k, ggml_sub(ctx0, ggml_mul(ctx0, a, ka), ka));

        r = ggml_reshape_3d(ctx0, r, head_size, head_count, n_tokens);
        w = ggml_reshape_3d(ctx0, w, head_size, head_count, n_tokens);
        k = ggml_reshape_3d(ctx0, k, head_size, head_count, n_tokens);
        v = ggml_reshape_3d(ctx0, v, head_size, head_count, n_tokens);
        a = ggml_reshape_3d(ctx0, a, head_size, head_count, n_tokens);

        ggml_tensor * wkv_state = build_copy_mask_state(
                gf, kv_self->v_l[il], state_copy, state_mask,
                hparams.n_embd_v_s(), n_seqs);

        ggml_tensor * wkv_output = ggml_rwkv_wkv7(ctx0, r, w, k, v, ggml_neg(ctx0, kk), ggml_mul(ctx0, kk, a), wkv_state);
        cur = ggml_view_1d(ctx0, wkv_output, n_embd * n_tokens, 0);
        wkv_state = ggml_view_1d(ctx0, wkv_output, n_embd * head_size * n_seqs, n_embd * n_tokens * sizeof(float));

        ggml_build_forward_expand(
                gf,
                ggml_cpy(
                    ctx0,
                    wkv_state,
                    ggml_view_1d(
                        ctx0,
                        kv_self->v_l[il],
                        hparams.n_embd_v_s() * n_seqs,
                        hparams.n_embd_v_s() * kv_head * ggml_element_size(kv_self->v_l[il])
                        )
                    )
                );

        if (layer.time_mix_ln && layer.time_mix_ln_b) {
            // group norm with head_count groups
            cur = ggml_reshape_3d(ctx0, cur, n_embd / head_count, head_count, n_tokens);
            cur = ggml_norm(ctx0, cur, 64e-5f);

            // Convert back to regular vectors.
            cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);
            cur = ggml_add(ctx0, ggml_mul(ctx0, cur, layer.time_mix_ln), layer.time_mix_ln_b);
        } else {
            cur = ggml_reshape_2d(ctx0, cur, n_embd, n_tokens);
        }

        ggml_tensor * rk = ggml_sum_rows(ctx0,
                ggml_mul(ctx0, ggml_mul(ctx0, k, r), ggml_reshape_2d(ctx0, layer.time_mix_r_k, head_size, head_count)));
        cur = ggml_add(ctx0, cur, ggml_reshape_2d(ctx0, ggml_mul(ctx0, v, rk), n_embd, n_tokens));

        if (has_gating) {
            cur = ggml_mul(ctx0, cur, g);
        }
        cur = build_lora_mm(layer.time_mix_output, cur);

        return ggml_reshape_3d(ctx0, cur, n_embd, n_seq_tokens, n_seqs);
    }